

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::LinearConstraint::LinearConstraintImplementation::
LinearConstraintImplementation(LinearConstraintImplementation *this,size_t size)

{
  uint in_ESI;
  undefined1 *in_RDI;
  SparsityStructure *this_00;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *)
             0x37f5dd);
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *)
             0x37f5f0);
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x28),(ulong)in_ESI);
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x48),(ulong)in_ESI);
  in_RDI[0x68] = 0;
  in_RDI[0x69] = 0;
  this_00 = (SparsityStructure *)(in_RDI + 0x70);
  SparsityStructure::SparsityStructure(this_00);
  SparsityStructure::SparsityStructure(this_00);
  iDynTree::VectorDynSize::zero();
  iDynTree::VectorDynSize::zero();
  return;
}

Assistant:

LinearConstraintImplementation(size_t size)
                : constrainsState(false)
                , constrainsControl(false)
                , stateConstraintsBuffer(static_cast<unsigned int>(size))
                , controlConstraintsBuffer(static_cast<unsigned int>(size))
                , hasStateSparsity(false)
                , hasControlSparsity(false)
            {
                stateConstraintsBuffer.zero();
                controlConstraintsBuffer.zero();
            }